

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__pic_test(stbi__context *s)

{
  int iVar1;
  int iVar2;
  stbi_uc *psVar3;
  stbi_uc *psVar4;
  
  iVar1 = stbi__pic_is4(s,anon_var_dwarf_4fe24);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    psVar4 = s->img_buffer;
    psVar3 = s->img_buffer_end;
    iVar1 = 0x54;
    do {
      if (psVar4 < psVar3) {
        psVar4 = psVar4 + 1;
LAB_0013e226:
        s->img_buffer = psVar4;
      }
      else if (s->read_from_callbacks != 0) {
        iVar2 = (*(s->io).read)(s->io_user_data,(char *)s->buffer_start,s->buflen);
        if (iVar2 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          psVar3 = s->buffer_start + 1;
        }
        else {
          psVar3 = s->buffer_start + iVar2;
        }
        s->img_buffer_end = psVar3;
        psVar4 = s->buffer_start + 1;
        goto LAB_0013e226;
      }
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    iVar1 = stbi__pic_is4(s,"PICT");
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return iVar1;
}

Assistant:

static int stbi__pic_test(stbi__context *s)
{
   int r = stbi__pic_test_core(s);
   stbi__rewind(s);
   return r;
}